

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  ItemVector *this_01;
  pointer pIVar3;
  size_type sVar4;
  ulong uVar5;
  ostream *poVar6;
  string local_2b0;
  string local_290;
  undefined4 local_270;
  allocator local_269;
  key_type local_268;
  undefined1 local_248 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  string local_210;
  byte local_1e9;
  const_iterator cStack_1e8;
  bool skippable;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_1e0;
  const_iterator li;
  string config;
  ItemVector *items;
  ostringstream fout;
  string *stdLibString_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineDeviceComputer *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&items);
  this_01 = cmComputeLinkInformation::GetItems(cli);
  cmComputeLinkInformation::GetConfig_abi_cxx11_((string *)&li,cli);
  local_1e0._M_current =
       (Item *)std::
               vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               ::begin(this_01);
  while( true ) {
    cStack_1e8 = std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end(this_01);
    bVar1 = __gnu_cxx::operator!=(&local_1e0,&stack0xfffffffffffffe18);
    if (!bVar1) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
             ::operator->(&local_1e0);
    if (pIVar3->Target != (cmGeneratorTarget *)0x0) {
      local_1e9 = 0;
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_1e0);
      TVar2 = cmGeneratorTarget::GetType(pIVar3->Target);
      if (TVar2 == STATIC_LIBRARY) {
        pIVar3 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_1e0);
        this_00 = pIVar3->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_210,"CUDA_RESOLVE_DEVICE_SYMBOLS",
                   (allocator *)((long)&langs._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
        ;
        local_1e9 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&langs._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      }
      else if ((TVar2 - SHARED_LIBRARY < 2) || (TVar2 == INTERFACE_LIBRARY)) {
        local_1e9 = 1;
      }
      if ((local_1e9 & 1) == 0) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248);
        pIVar3 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_1e0);
        cmGeneratorTarget::GetLanguages
                  (pIVar3->Target,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_248,(string *)&li);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_268,"CUDA",&local_269);
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_248,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
        if (sVar4 == 0) {
          local_270 = 4;
        }
        else {
          pIVar3 = __gnu_cxx::
                   __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                   ::operator->(&local_1e0);
          if ((pIVar3->IsPath & 1U) == 0) {
            pIVar3 = __gnu_cxx::
                     __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                     ::operator->(&local_1e0);
            std::operator<<((ostream *)&items,(string *)pIVar3);
          }
          else {
            pIVar3 = __gnu_cxx::
                     __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                     ::operator->(&local_1e0);
            (*(this->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[2])(&local_2b0,this,pIVar3);
            cmLinkLineComputer::ConvertToOutputFormat
                      (&local_290,&this->super_cmLinkLineComputer,&local_2b0);
            std::operator<<((ostream *)&items,(string *)&local_290);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::~string((string *)&local_2b0);
          }
          std::operator<<((ostream *)&items," ");
          local_270 = 0;
        }
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&local_1e0);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&items,(string *)stdLibString);
    std::operator<<(poVar6," ");
  }
  std::__cxx11::ostringstream::str();
  local_270 = 1;
  std::__cxx11::string::~string((string *)&li);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&items);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  for (ItemVector::const_iterator li = items.begin(); li != items.end();
       ++li) {
    if (!li->Target) {
      continue;
    }

    bool skippable = false;
    switch (li->Target->GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::INTERFACE_LIBRARY:
        skippable = true;
        break;
      case cmStateEnums::STATIC_LIBRARY:
        // If a static library is resolving its device linking, it should
        // be removed for other device linking
        skippable =
          li->Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
        break;
      default:
        break;
    }

    if (skippable) {
      continue;
    }

    std::set<std::string> langs;
    li->Target->GetLanguages(langs, config);
    if (langs.count("CUDA") == 0) {
      continue;
    }

    if (li->IsPath) {
      fout << this->ConvertToOutputFormat(
        this->ConvertToLinkReference(li->Value));
    } else {
      fout << li->Value;
    }
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}